

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall
CVmObjStringBuffer::add_undo_rec
          (CVmObjStringBuffer *this,vm_obj_id_t self,strbuf_undo_action action,int32_t idx,
          int32_t old_len,int32_t new_len)

{
  int iVar1;
  int *__ptr;
  vm_strbuf_ext *pvVar2;
  int in_ECX;
  int in_EDX;
  CVmObjStringBuffer *in_RDI;
  int in_R8D;
  int in_R9D;
  vm_val_t nilval;
  strbuf_undo_rec *rec;
  int32_t siz;
  vm_val_t *in_stack_ffffffffffffffb8;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  int local_20;
  int local_10;
  
  if ((in_R8D != 0) || (in_R9D != 0)) {
    local_10 = in_EDX;
    if ((in_EDX == 2) && (in_R8D == 0)) {
      local_10 = 0;
    }
    if ((local_10 == 2) && (in_R9D == 0)) {
      local_10 = 1;
    }
    local_20 = 0x14;
    if ((local_10 == 1) || (local_10 == 2)) {
      local_20 = (in_R8D + -1) * 4 + 0x14;
    }
    __ptr = (int *)malloc((long)local_20);
    *__ptr = local_10;
    __ptr[1] = in_ECX;
    __ptr[2] = in_R8D;
    __ptr[3] = in_R9D;
    if ((local_10 == 1) || (local_10 == 2)) {
      in_stack_ffffffffffffffb8 = (vm_val_t *)(__ptr + 4);
      pvVar2 = get_ext(in_RDI);
      memcpy(in_stack_ffffffffffffffb8,pvVar2->buf + in_ECX,(long)in_R8D << 2);
    }
    vm_val_t::set_nil((vm_val_t *)&stack0xffffffffffffffc8);
    iVar1 = CVmUndo::add_new_record_ptr_key
                      ((CVmUndo *)in_stack_ffffffffffffffd0.native_desc,in_stack_ffffffffffffffcc,
                       in_RDI,in_stack_ffffffffffffffb8);
    if (iVar1 == 0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

void CVmObjStringBuffer::add_undo_rec(
    VMG_ vm_obj_id_t self, strbuf_undo_action action,
    int32_t idx, int32_t old_len, int32_t new_len)
{
    /* 
     *   if we're not inserting or deleting anything, there's no change, so
     *   there's no undo information to save 
     */
    if (old_len == 0 && new_len == 0)
        return;

    /* 
     *   replacing zero bytes is simply an insertion; substituting zero bytes
     *   is a deletion 
     */
    if (action == STRBUF_UNDO_REPL && old_len == 0)
        action = STRBUF_UNDO_INS;
    if (action == STRBUF_UNDO_REPL && new_len == 0)
        action = STRBUF_UNDO_DEL;

    /* 
     *   Figure the size for the extension record.  For an insertion, we
     *   don't need any extra data, since we're replacing zero characters.
     *   For a deletion or replacement, we need to make a copy of the
     *   characters we're removing, so we need old_len extra wchar_t's.  
     */
    int32_t siz = sizeof(strbuf_undo_rec);
    if (action == STRBUF_UNDO_DEL || action == STRBUF_UNDO_REPL)
        siz += (old_len - 1) * sizeof(wchar_t);

    /* allocate our record extension */
    strbuf_undo_rec *rec = (strbuf_undo_rec *)t3malloc(siz);

    /* set up the record */
    rec->action = action;
    rec->idx = idx;
    rec->old_len = old_len;
    rec->new_len = new_len;

    /* if we're deleting or replacing text, save the old text */
    if (action == STRBUF_UNDO_DEL || action == STRBUF_UNDO_REPL)
        memcpy(rec->str, get_ext()->buf + idx, old_len * sizeof(rec->str[0]));
    
    /* 
     *   Add the record to the global undo stream.  (We don't have anything
     *   to store in the 'value' field, so just store nil.) 
     */
    vm_val_t nilval;
    nilval.set_nil();
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec, &nilval))
    {
        /* 
         *   we didn't add an undo record, so our extra undo information
         *   isn't actually going to be stored in the undo system - hence we
         *   must delete our extra information 
         */
        t3free(rec);
    }
}